

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildConfig *config;
  CommandRunner *pCVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  RealCommandRunner *this_00;
  Edge *edge;
  int iVar6;
  int local_68;
  int local_64;
  Result result;
  
  if (((this->plan_).wanted_edges_ < 1) || (iVar6 = (this->plan_).command_edges_, iVar6 < 1)) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build.cc"
                  ,0x32b,"bool Builder::Build(string *)");
  }
  this->status_->total_edges_ = iVar6;
  config = this->config_;
  iVar6 = config->failures_allowed;
  if ((this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl == (CommandRunner *)0x0) {
    if (config->dry_run == true) {
      this_00 = (RealCommandRunner *)operator_new(0x58);
      (this_00->super_CommandRunner)._vptr_CommandRunner =
           (_func_int **)&PTR__DryRunCommandRunner_001c1be0;
      std::queue<Edge*,std::deque<Edge*,std::allocator<Edge*>>>::
      queue<std::deque<Edge*,std::allocator<Edge*>>,void>
                ((queue<Edge_*,_std::deque<Edge_*,_std::allocator<Edge_*>_>_> *)&this_00->config_);
    }
    else {
      this_00 = (RealCommandRunner *)operator_new(0x2f0);
      RealCommandRunner::RealCommandRunner(this_00,config);
    }
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    (this->command_runner_)._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = &this_00->super_CommandRunner;
    if (pCVar1 != (CommandRunner *)0x0) {
      (*pCVar1->_vptr_CommandRunner[1])();
    }
  }
  BuildStatus::BuildStarted(this->status_);
  local_64 = 0;
  iVar5 = local_64;
LAB_001641c6:
  do {
    while( true ) {
      bVar2 = (this->plan_).command_edges_ < 1 || (this->plan_).wanted_edges_ < 1;
      if (bVar2) goto LAB_00164326;
      local_68 = iVar5;
      if (((iVar6 != 0) &&
          (iVar4 = (*((this->command_runner_)._M_t.
                      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
                      .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->
                     _vptr_CommandRunner[2])(), local_68 = local_64, (char)iVar4 != '\0')) &&
         (edge = Plan::FindWork(&this->plan_), edge != (Edge *)0x0)) break;
      if (local_68 == 0) {
        BuildStatus::BuildFinished(this->status_);
        std::__cxx11::string::assign((char *)err);
        return bVar2;
      }
      result.edge = (Edge *)0x0;
      result.output._M_dataplus._M_p = (pointer)&result.output.field_2;
      result.output._M_string_length = 0;
      result.output.field_2._M_local_buf[0] = '\0';
      pCVar1 = (this->command_runner_)._M_t.
               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      iVar5 = (*pCVar1->_vptr_CommandRunner[4])(pCVar1,&result);
      if (((byte)iVar5 & result.status != ExitInterrupted) == 0) {
        Cleanup(this);
        BuildStatus::BuildFinished(this->status_);
        std::__cxx11::string::assign((char *)err);
LAB_00164303:
        bVar3 = false;
      }
      else {
        bVar3 = FinishCommand(this,&result,err);
        local_68 = local_68 + -1;
        if (!bVar3) {
          Cleanup(this);
          BuildStatus::BuildFinished(this->status_);
          goto LAB_00164303;
        }
        iVar6 = iVar6 - (uint)(result.status != ExitSuccess && iVar6 != 0);
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)&result.output);
      local_64 = local_68;
      iVar5 = local_68;
      if (!bVar3) {
        return bVar2;
      }
    }
    bVar3 = StartEdge(this,edge,err);
    if (!bVar3) goto LAB_0016431e;
    bVar3 = Edge::is_phony(edge);
    if (!bVar3) {
      local_64 = local_64 + 1;
      goto LAB_001641c6;
    }
    bVar3 = Plan::EdgeFinished(&this->plan_,edge,kEdgeSucceeded,err);
    if (!bVar3) {
LAB_0016431e:
      Cleanup(this);
LAB_00164326:
      BuildStatus::BuildFinished(this->status_);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool DryRunCommandRunner::CanRunMore() const {
  return true;
}